

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_add(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_DBL *param)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  undefined8 uVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  REF_INT geom;
  uint local_38;
  REF_INT local_34;
  
  if (2 < (uint)type) {
    return 3;
  }
  uVar3 = ref_geom_find(ref_geom,node,type,id,(REF_INT *)&local_38);
  if (uVar3 == 0) {
    if (type == 0) {
      return 0;
    }
    pRVar7 = ref_geom->param;
    pRVar7[(long)(int)local_38 * 2] = *param;
    if (type != 2) {
      return 0;
    }
    pRVar7[(int)(local_38 * 2 | 1)] = param[1];
    return 0;
  }
  if (uVar3 != 5) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x207,
           "ref_geom_add",(ulong)uVar3,"find failed");
    return uVar3;
  }
  if (ref_geom->blank != -1) goto LAB_001440f1;
  iVar8 = ref_geom->max;
  lVar13 = (long)iVar8;
  local_34 = id;
  if (lVar13 == 0x2aaaaaaa) {
    pcVar12 = "the number of geoms is too large for integers, cannot grow";
    uVar11 = 0x1d6;
LAB_0014409f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar11,
           "ref_geom_grow",pcVar12);
    bVar2 = false;
    uVar11 = 1;
  }
  else {
    if (0x2aaaaaa9 < iVar8) {
      pcVar12 = "chunk limit at max";
      uVar11 = 0x1dc;
      goto LAB_0014409f;
    }
    iVar10 = 1000;
    if (1000 < (int)((double)iVar8 * 1.5)) {
      iVar10 = (int)((double)iVar8 * 1.5);
    }
    if (0x2aaaaaaa - iVar8 <= iVar10) {
      iVar10 = 0x2aaaaaaa - iVar8;
    }
    ref_geom->max = iVar10 + iVar8;
    fflush(_stdout);
    if (0 < ref_geom->max) {
      pRVar6 = (REF_INT *)realloc(ref_geom->descr,(ulong)(uint)ref_geom->max * 0x18);
      ref_geom->descr = pRVar6;
    }
    if (ref_geom->descr == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1e2,
             "ref_geom_grow","realloc ref_geom->descr NULL");
      uVar1 = (long)ref_geom->max * 6;
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar1 & 0xffffffff,uVar1,4,
             (long)ref_geom->max * 0x18);
      bVar2 = false;
      uVar11 = 2;
    }
    else {
      fflush(_stdout);
      if (0 < ref_geom->max) {
        pRVar7 = (REF_DBL *)realloc(ref_geom->param,(ulong)(uint)ref_geom->max << 4);
        ref_geom->param = pRVar7;
      }
      if (ref_geom->param == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1e3,"ref_geom_grow","realloc ref_geom->param NULL");
        uVar1 = (long)ref_geom->max * 2;
        printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar1 & 0xffffffff,uVar1,8
               ,(long)ref_geom->max << 4);
        bVar2 = false;
        uVar11 = 2;
      }
      else {
        iVar10 = ref_geom->max;
        if (iVar8 < iVar10) {
          piVar9 = ref_geom->descr + lVar13 * 6 + 1;
          iVar4 = iVar8;
          do {
            iVar4 = iVar4 + 1;
            piVar9[-1] = -1;
            lVar13 = lVar13 + 1;
            *piVar9 = iVar4;
            iVar10 = ref_geom->max;
            piVar9 = piVar9 + 6;
          } while (lVar13 < iVar10);
        }
        ref_geom->descr[iVar10 * 6 + -5] = -1;
        ref_geom->blank = iVar8;
        uVar11 = 0;
        bVar2 = true;
      }
    }
  }
  id = local_34;
  if (!bVar2) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x210,
           "ref_geom_add",uVar11,"grow add");
    return (REF_STATUS)uVar11;
  }
LAB_001440f1:
  uVar3 = ref_geom->blank;
  lVar14 = (long)(int)uVar3;
  pRVar6 = ref_geom->descr;
  ref_geom->blank = pRVar6[lVar14 * 6 + 1];
  lVar13 = (long)(int)(uVar3 * 6);
  pRVar6[lVar13] = type;
  pRVar6[lVar14 * 6 + 1] = id;
  pRVar6[lVar13 + 2] = id;
  (pRVar6 + lVar13 + 3)[0] = 0;
  (pRVar6 + lVar13 + 3)[1] = 0;
  pRVar6[lVar13 + 5] = node;
  pRVar7 = ref_geom->param;
  pRVar7[lVar14 * 2] = 0.0;
  iVar8 = uVar3 * 2 + 1;
  pRVar7[iVar8] = 0.0;
  if ((type != 0) && (pRVar7[lVar14 * 2] = *param, type == 2)) {
    pRVar7[iVar8] = param[1];
  }
  local_38 = uVar3;
  uVar5 = ref_adj_add(ref_geom->ref_adj,node,uVar3);
  if (uVar5 == 0) {
    ref_geom->n = ref_geom->n + 1;
    uVar5 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x226,
           "ref_geom_add",(ulong)uVar5,"register geom");
    pRVar6 = ref_geom->descr;
    printf("register node %d geom %d type %d id %d\n",(ulong)(uint)pRVar6[lVar13 + 5],(ulong)uVar3,
           (ulong)(uint)pRVar6[lVar13],(ulong)(uint)pRVar6[lVar14 * 6 + 1]);
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                REF_INT id, REF_DBL *param) {
  REF_INT geom;
  REF_STATUS status;

  if (type < 0 || 2 < type) return REF_INVALID;

  status = ref_geom_find(ref_geom, node, type, id, &geom);
  RXS(status, REF_NOT_FOUND, "find failed");

  if (REF_SUCCESS == status) {
    if (type > 0) ref_geom_param(ref_geom, 0, geom) = param[0];
    if (type > 1) ref_geom_param(ref_geom, 1, geom) = param[1];
    return REF_SUCCESS;
  }

  if (REF_EMPTY == ref_geom_blank(ref_geom)) {
    RSS(ref_geom_grow(ref_geom), "grow add");
  }

  geom = ref_geom_blank(ref_geom);
  ref_geom_blank(ref_geom) = ref_geom_id(ref_geom, geom);

  ref_geom_type(ref_geom, geom) = type;
  ref_geom_id(ref_geom, geom) = id;
  ref_geom_gref(ref_geom, geom) = id; /* assume same until set */
  ref_geom_jump(ref_geom, geom) = 0;
  ref_geom_degen(ref_geom, geom) = 0;
  ref_geom_node(ref_geom, geom) = node;

  ref_geom_param(ref_geom, 0, geom) = 0.0;
  ref_geom_param(ref_geom, 1, geom) = 0.0;
  if (type > 0) ref_geom_param(ref_geom, 0, geom) = param[0];
  if (type > 1) ref_geom_param(ref_geom, 1, geom) = param[1];

  RSB(ref_adj_add(ref_geom->ref_adj, node, geom), "register geom", {
    printf("register node %d geom %d type %d id %d\n",
           ref_geom_node(ref_geom, geom), geom, ref_geom_type(ref_geom, geom),
           ref_geom_id(ref_geom, geom));
  });

  ref_geom_n(ref_geom)++;

  return REF_SUCCESS;
}